

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     BinaryScatterLoop<duckdb::ArgMinMaxState<long,int>,long,int,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (long *adata,AggregateInputData *aggr_input_data,int *bdata,
               ArgMinMaxState<long,_int> **states,idx_t count,SelectionVector *asel,
               SelectionVector *bsel,SelectionVector *ssel,ValidityMask *avalidity,
               ValidityMask *bvalidity)

{
  int iVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  ArgMinMaxState<long,_int> *pAVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  idx_t iVar14;
  idx_t iVar15;
  
  puVar2 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  puVar3 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0 && puVar3 == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar4 = asel->sel_vector;
      psVar5 = bsel->sel_vector;
      psVar6 = ssel->sel_vector;
      uVar10 = 0;
      do {
        uVar11 = uVar10;
        if (psVar4 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar4[uVar10];
        }
        uVar8 = uVar10;
        if (psVar5 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar5[uVar10];
        }
        uVar13 = uVar10;
        if (psVar6 != (sel_t *)0x0) {
          uVar13 = (ulong)psVar6[uVar10];
        }
        pAVar7 = states[uVar13];
        if ((pAVar7->super_ArgMinMaxStateBase).is_initialized == false) {
          pAVar7->arg = adata[uVar11];
          pAVar7->value = bdata[uVar8];
          (pAVar7->super_ArgMinMaxStateBase).is_initialized = true;
        }
        else {
          iVar1 = bdata[uVar8];
          if (iVar1 < pAVar7->value) {
            pAVar7->arg = adata[uVar11];
            pAVar7->value = iVar1;
          }
        }
        uVar10 = uVar10 + 1;
      } while (count != uVar10);
    }
  }
  else if (count != 0) {
    psVar4 = asel->sel_vector;
    psVar5 = bsel->sel_vector;
    psVar6 = ssel->sel_vector;
    iVar9 = 0;
    do {
      iVar14 = iVar9;
      if (psVar4 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar4[iVar9];
      }
      iVar15 = iVar9;
      if (psVar5 != (sel_t *)0x0) {
        iVar15 = (idx_t)psVar5[iVar9];
      }
      iVar12 = iVar9;
      if (psVar6 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar6[iVar9];
      }
      if (((puVar2 == (unsigned_long *)0x0) || ((puVar2[iVar14 >> 6] >> (iVar14 & 0x3f) & 1) != 0))
         && ((puVar3 == (unsigned_long *)0x0 || ((puVar3[iVar15 >> 6] >> (iVar15 & 0x3f) & 1) != 0))
            )) {
        pAVar7 = states[iVar12];
        if ((pAVar7->super_ArgMinMaxStateBase).is_initialized == false) {
          pAVar7->arg = adata[iVar14];
          pAVar7->value = bdata[iVar15];
          (pAVar7->super_ArgMinMaxStateBase).is_initialized = true;
        }
        else {
          iVar1 = bdata[iVar15];
          if (iVar1 < pAVar7->value) {
            pAVar7->arg = adata[iVar14];
            pAVar7->value = iVar1;
          }
        }
      }
      iVar9 = iVar9 + 1;
    } while (count != iVar9);
  }
  return;
}

Assistant:

static inline void BinaryScatterLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                     const B_TYPE *__restrict bdata, STATE_TYPE **__restrict states, idx_t count,
	                                     const SelectionVector &asel, const SelectionVector &bsel,
	                                     const SelectionVector &ssel, ValidityMask &avalidity,
	                                     ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
					                                                       bdata[input.ridx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
				                                                       bdata[input.ridx], input);
			}
		}
	}